

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall TiXmlAttributeSet::Remove(TiXmlAttributeSet *this,TiXmlAttribute *removeMe)

{
  TiXmlAttribute *pTVar1;
  TiXmlAttribute *pTVar2;
  TiXmlAttribute *pTVar3;
  
  pTVar3 = &this->sentinel;
  do {
    pTVar3 = pTVar3->next;
    if (pTVar3 == &this->sentinel) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                    ,0x608,"void TiXmlAttributeSet::Remove(TiXmlAttribute *)");
    }
  } while (pTVar3 != removeMe);
  pTVar1 = pTVar3->prev;
  pTVar2 = pTVar3->next;
  pTVar1->next = pTVar2;
  pTVar2->prev = pTVar1;
  pTVar3->prev = (TiXmlAttribute *)0x0;
  pTVar3->next = (TiXmlAttribute *)0x0;
  return;
}

Assistant:

void TiXmlAttributeSet::Remove( TiXmlAttribute* removeMe )
{
	TiXmlAttribute* node;

	for( node = sentinel.next; node != &sentinel; node = node->next )
	{
		if ( node == removeMe )
		{
			node->prev->next = node->next;
			node->next->prev = node->prev;
			node->next = 0;
			node->prev = 0;
			return;
		}
	}
	assert( 0 );		// we tried to remove a non-linked attribute.
}